

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalInsert::Combine
          (PhysicalInsert *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  __pthread_internal_list **pp_Var1;
  GlobalSinkState *pGVar2;
  LocalSinkState *pLVar3;
  TableCatalogEntry *table;
  TransactionData transaction;
  int iVar4;
  QueryProfiler *this_00;
  undefined4 extraout_var;
  idx_t iVar5;
  DataTable *this_01;
  RowGroupCollection *this_02;
  idx_t iVar6;
  DuckTransaction *transaction_00;
  pointer pOVar7;
  DataTable *pDVar8;
  OptimisticDataWriter *this_03;
  type other;
  pointer *this_04;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  TransactionData tdata;
  LocalAppendState append_state;
  
  pGVar2 = input->global_state;
  pLVar3 = input->local_state;
  this_00 = QueryProfiler::Get(context->client);
  OperatorProfiler::Flush(&context->thread->profiler,&this->super_PhysicalOperator);
  QueryProfiler::Flush(this_00,&context->thread->profiler);
  if ((this->parallel == true) &&
     (pLVar3[7].partition_info.partition_data.
      super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0xffffffffffffffff)) {
    table = (TableCatalogEntry *)
            pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
            __prev;
    iVar4 = (*(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
              _vptr_CatalogEntry[0x10])();
    pDVar8 = (DataTable *)CONCAT44(extraout_var,iVar4);
    iVar5 = DataTable::GetRowGroupSize(pDVar8);
    TransactionData::TransactionData(&tdata,0,0);
    this_01 = (DataTable *)
              (*(code *)(pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                         __data.__list.__prev)->__prev[8].__prev)();
    this_02 = DataTable::GetOptimisticCollection
                        (this_01,context->client,
                         (PhysicalIndex)
                         pLVar3[7].partition_info.partition_data.
                         super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                         .
                         super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    transaction.transaction_id = tdata.transaction_id;
    transaction.transaction.ptr = tdata.transaction.ptr;
    transaction.start_time = tdata.start_time;
    RowGroupCollection::FinalizeAppend
              (this_02,transaction,(TableAppendState *)&pLVar3[2].partition_info.min_batch_index);
    iVar6 = RowGroupCollection::GetTotalRows(this_02);
    ::std::mutex::lock((mutex *)&((pthread_mutex_t *)(pGVar2 + 1))->__data);
    pp_Var1 = &pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
               __list.__next;
    *pp_Var1 = (__pthread_internal_list *)((long)&(*pp_Var1)->__prev + iVar6);
    if (iVar6 < iVar5) {
      LocalAppendState::LocalAppendState(&append_state);
      DataTable::InitializeLocalAppend
                (pDVar8,&append_state,table,context->client,&this->bound_constraints);
      transaction_00 =
           DuckTransaction::Get
                     (context->client,(table->super_StandardEntry).super_InCatalogEntry.catalog);
      local_168 = (code *)0x0;
      pcStack_160 = (code *)0x0;
      local_178._M_unused._M_object = (void *)0x0;
      local_178._8_8_ = 0;
      local_178._M_unused._M_object = operator_new(0x18);
      *(DataTable **)local_178._M_unused._0_8_ = pDVar8;
      *(LocalAppendState **)((long)local_178._M_unused._0_8_ + 8) = &append_state;
      *(ExecutionContext **)((long)local_178._M_unused._0_8_ + 0x10) = context;
      pcStack_160 = ::std::
                    _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_insert.cpp:692:32)>
                    ::_M_invoke;
      local_168 = ::std::
                  _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/execution/operator/persistent/physical_insert.cpp:692:32)>
                  ::_M_manager;
      RowGroupCollection::Scan
                (this_02,transaction_00,(function<bool_(duckdb::DataChunk_&)> *)&local_178);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_178);
      DataTable::FinalizeLocalAppend(pDVar8,&append_state);
      LocalAppendState::~LocalAppendState(&append_state);
    }
    else {
      this_04 = &pLVar3[7].partition_info.partition_data.
                 super_vector<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                 .
                 super__Vector_base<duckdb::ColumnPartitionData,_std::allocator<duckdb::ColumnPartitionData>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pOVar7 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
               ::operator->((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                             *)this_04);
      OptimisticDataWriter::WriteLastRowGroup(pOVar7,this_02);
      pOVar7 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
               ::operator->((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                             *)this_04);
      OptimisticDataWriter::FinalFlush(pOVar7);
      pDVar8 = (DataTable *)
               (*(code *)(pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                          __data.__list.__prev)->__prev[8].__prev)();
      DataTable::LocalMerge(pDVar8,context->client,this_02);
      pDVar8 = (DataTable *)
               (*(code *)(pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                          __data.__list.__prev)->__prev[8].__prev)();
      this_03 = DataTable::GetOptimisticWriter(pDVar8,context->client);
      other = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
              ::operator*((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                           *)this_04);
      OptimisticDataWriter::Merge(this_03,other);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(pGVar2 + 1));
  }
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalInsert::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &gstate = input.global_state.Cast<InsertGlobalState>();
	auto &lstate = input.local_state.Cast<InsertLocalState>();
	auto &client_profiler = QueryProfiler::Get(context.client);
	context.thread.profiler.Flush(*this);
	client_profiler.Flush(context.thread.profiler);

	if (!parallel || !lstate.collection_index.IsValid()) {
		return SinkCombineResultType::FINISHED;
	}

	auto &table = gstate.table;
	auto &storage = table.GetStorage();
	const idx_t row_group_size = storage.GetRowGroupSize();

	// parallel append: finalize the append
	TransactionData tdata(0, 0);
	auto &data_table = gstate.table.GetStorage();
	auto &collection = data_table.GetOptimisticCollection(context.client, lstate.collection_index);
	collection.FinalizeAppend(tdata, lstate.local_append_state);

	auto append_count = collection.GetTotalRows();

	lock_guard<mutex> lock(gstate.lock);
	gstate.insert_count += append_count;
	if (append_count < row_group_size) {
		// we have few rows - append to the local storage directly
		LocalAppendState append_state;
		storage.InitializeLocalAppend(append_state, table, context.client, bound_constraints);
		auto &transaction = DuckTransaction::Get(context.client, table.catalog);
		collection.Scan(transaction, [&](DataChunk &insert_chunk) {
			storage.LocalAppend(append_state, context.client, insert_chunk, false);
			return true;
		});
		storage.FinalizeLocalAppend(append_state);
	} else {
		// we have written rows to disk optimistically - merge directly into the transaction-local storage
		lstate.optimistic_writer->WriteLastRowGroup(collection);
		lstate.optimistic_writer->FinalFlush();
		gstate.table.GetStorage().LocalMerge(context.client, collection);
		auto &optimistic_writer = gstate.table.GetStorage().GetOptimisticWriter(context.client);
		optimistic_writer.Merge(*lstate.optimistic_writer);
	}

	return SinkCombineResultType::FINISHED;
}